

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O0

UnitsPtr __thiscall libcellml::Variable::units(Variable *this)

{
  VariableImpl *pVVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Variable *in_RSI;
  UnitsPtr UVar2;
  Variable *this_local;
  
  pVVar1 = pFunc(in_RSI);
  std::shared_ptr<libcellml::Units>::shared_ptr
            ((shared_ptr<libcellml::Units> *)this,&pVVar1->mUnits);
  UVar2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  UVar2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (UnitsPtr)UVar2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

UnitsPtr Variable::units() const
{
    return pFunc()->mUnits;
}